

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fBufferWriteTests.cpp
# Opt level: O0

void __thiscall deqp::gles3::Functional::RandomBufferWriteCase::deinit(RandomBufferWriteCase *this)

{
  BufferVerifier *this_00;
  RandomBufferWriteCase *this_local;
  
  deqp::gls::BufferTestUtil::BufferCase::deleteBuffer(&this->super_BufferCase,this->m_buffer);
  deqp::gls::BufferTestUtil::ReferenceBuffer::setSize(&this->m_refBuffer,0);
  this_00 = this->m_verifier;
  if (this_00 != (BufferVerifier *)0x0) {
    deqp::gls::BufferTestUtil::BufferVerifier::~BufferVerifier(this_00);
    operator_delete(this_00,8);
  }
  this->m_verifier = (BufferVerifier *)0x0;
  deqp::gls::BufferTestUtil::BufferCase::deinit(&this->super_BufferCase);
  return;
}

Assistant:

void deinit (void)
	{
		deleteBuffer(m_buffer);
		m_refBuffer.setSize(0);

		delete m_verifier;
		m_verifier = DE_NULL;

		BufferCase::deinit();
	}